

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

_Bool cf_h2_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  RTSP *pRVar1;
  Curl_cfilter *pCVar2;
  _Bool _Var3;
  void *pvVar4;
  
  if ((data == (Curl_easy *)0x0) || (pRVar1 = (data->req).p.rtsp, pRVar1 == (RTSP *)0x0)) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = (pRVar1->http_wrapper).h2_ctx;
  }
  if (cf->ctx != (void *)0x0) {
    _Var3 = Curl_bufq_is_empty((bufq *)((long)cf->ctx + 0x18));
    if (!_Var3) {
      return true;
    }
    if (pvVar4 != (void *)0x0) {
      _Var3 = Curl_bufq_is_empty((bufq *)((long)pvVar4 + 0x48));
      if (!_Var3) {
        return true;
      }
      _Var3 = Curl_bufq_is_empty((bufq *)((long)pvVar4 + 8));
      if (!_Var3) {
        return true;
      }
    }
  }
  pCVar2 = cf->next;
  if (pCVar2 == (Curl_cfilter *)0x0) {
    return false;
  }
  _Var3 = (*pCVar2->cft->has_data_pending)(pCVar2,data);
  return _Var3;
}

Assistant:

static bool cf_h2_data_pending(struct Curl_cfilter *cf,
                               const struct Curl_easy *data)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  if(ctx && (!Curl_bufq_is_empty(&ctx->inbufq)
            || (stream && !Curl_bufq_is_empty(&stream->sendbuf))
            || (stream && !Curl_bufq_is_empty(&stream->recvbuf))))
    return TRUE;
  return cf->next? cf->next->cft->has_data_pending(cf->next, data) : FALSE;
}